

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O3

HTS_Boolean
HTS_SStreamSet_create
          (HTS_SStreamSet *sss,HTS_ModelSet *ms,HTS_Label *label,HTS_Boolean phoneme_alignment_flag,
          double speed,double *duration_iw,double **parameter_iw,double **gv_iw)

{
  undefined8 *puVar1;
  double dVar2;
  bool bVar3;
  HTS_Boolean HVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t *psVar8;
  HTS_SStream *pHVar9;
  double **ppdVar10;
  double *pdVar11;
  size_t sVar12;
  HTS_Boolean *pHVar13;
  double *vari;
  char *pcVar14;
  long lVar15;
  int *piVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  undefined1 auVar24 [16];
  size_t local_68;
  
  sVar6 = HTS_Label_get_size(label);
  if ((sVar6 != 0) && (sVar6 = HTS_ModelSet_get_nvoices(ms), sVar6 != 0)) {
    dVar23 = 0.0;
    uVar21 = 0;
    do {
      dVar23 = dVar23 + duration_iw[uVar21];
      uVar21 = uVar21 + 1;
      sVar6 = HTS_ModelSet_get_nvoices(ms);
    } while (uVar21 < sVar6);
    if ((dVar23 != 0.0) || (NAN(dVar23))) {
      if (((dVar23 != 1.0) || (NAN(dVar23))) && (sVar6 = HTS_ModelSet_get_nvoices(ms), sVar6 != 0))
      {
        uVar21 = 0;
        do {
          dVar2 = duration_iw[uVar21];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            duration_iw[uVar21] = dVar2 / dVar23;
          }
          uVar21 = uVar21 + 1;
          sVar6 = HTS_ModelSet_get_nvoices(ms);
        } while (uVar21 < sVar6);
      }
      sVar6 = HTS_ModelSet_get_nstream(ms);
      if (sVar6 != 0) {
        sVar6 = 0;
        do {
          sVar7 = HTS_ModelSet_get_nvoices(ms);
          if (sVar7 == 0) {
            return '\0';
          }
          dVar23 = 0.0;
          uVar21 = 0;
          do {
            dVar23 = dVar23 + parameter_iw[uVar21][sVar6];
            uVar21 = uVar21 + 1;
            sVar7 = HTS_ModelSet_get_nvoices(ms);
          } while (uVar21 < sVar7);
          if ((dVar23 == 0.0) && (!NAN(dVar23))) {
            return '\0';
          }
          if (((dVar23 != 1.0) || (NAN(dVar23))) &&
             (sVar7 = HTS_ModelSet_get_nvoices(ms), sVar7 != 0)) {
            uVar21 = 0;
            do {
              dVar2 = parameter_iw[uVar21][sVar6];
              if ((dVar2 != 0.0) || (NAN(dVar2))) {
                parameter_iw[uVar21][sVar6] = dVar2 / dVar23;
              }
              uVar21 = uVar21 + 1;
              sVar7 = HTS_ModelSet_get_nvoices(ms);
            } while (uVar21 < sVar7);
          }
          HVar4 = HTS_ModelSet_use_gv(ms,sVar6);
          if (HVar4 != '\0') {
            sVar7 = HTS_ModelSet_get_nvoices(ms);
            if (sVar7 == 0) {
              return '\0';
            }
            dVar23 = 0.0;
            uVar21 = 0;
            do {
              dVar23 = dVar23 + gv_iw[uVar21][sVar6];
              uVar21 = uVar21 + 1;
              sVar7 = HTS_ModelSet_get_nvoices(ms);
            } while (uVar21 < sVar7);
            if ((dVar23 == 0.0) && (!NAN(dVar23))) {
              return '\0';
            }
            if (((dVar23 != 1.0) || (NAN(dVar23))) &&
               (sVar7 = HTS_ModelSet_get_nvoices(ms), sVar7 != 0)) {
              uVar21 = 0;
              do {
                dVar2 = gv_iw[uVar21][sVar6];
                if ((dVar2 != 0.0) || (NAN(dVar2))) {
                  gv_iw[uVar21][sVar6] = dVar2 / dVar23;
                }
                uVar21 = uVar21 + 1;
                sVar7 = HTS_ModelSet_get_nvoices(ms);
              } while (uVar21 < sVar7);
            }
          }
          sVar6 = sVar6 + 1;
          sVar7 = HTS_ModelSet_get_nstream(ms);
        } while (sVar6 < sVar7);
      }
      sVar6 = HTS_ModelSet_get_nstate(ms);
      sss->nstate = sVar6;
      sVar6 = HTS_ModelSet_get_nstream(ms);
      sss->nstream = sVar6;
      sss->total_frame = 0;
      sVar6 = HTS_Label_get_size(label);
      sVar6 = sVar6 * sss->nstate;
      sss->total_state = sVar6;
      psVar8 = (size_t *)HTS_calloc(sVar6,8);
      sss->duration = psVar8;
      pHVar9 = (HTS_SStream *)HTS_calloc(sss->nstream,0x60);
      sss->sstream = pHVar9;
      if (sss->nstream != 0) {
        sVar6 = 0;
        do {
          pHVar9 = sss->sstream;
          sVar7 = HTS_ModelSet_get_vector_length(ms,sVar6);
          pHVar9[sVar6].vector_length = sVar7;
          ppdVar10 = (double **)HTS_calloc(sss->total_state,8);
          pHVar9[sVar6].mean = ppdVar10;
          ppdVar10 = (double **)HTS_calloc(sss->total_state,8);
          pHVar9[sVar6].vari = ppdVar10;
          HVar4 = HTS_ModelSet_is_msd(ms,sVar6);
          if (HVar4 == '\0') {
            pdVar11 = (double *)0x0;
          }
          else {
            pdVar11 = (double *)HTS_calloc(sss->total_state,8);
          }
          pHVar9 = pHVar9 + sVar6;
          pHVar9->msd = pdVar11;
          if (sss->total_state != 0) {
            uVar21 = 0;
            do {
              sVar7 = pHVar9->vector_length;
              sVar12 = HTS_ModelSet_get_window_size(ms,sVar6);
              pdVar11 = (double *)HTS_calloc(sVar7 * sVar12,8);
              pHVar9->mean[uVar21] = pdVar11;
              sVar7 = pHVar9->vector_length;
              sVar12 = HTS_ModelSet_get_window_size(ms,sVar6);
              pdVar11 = (double *)HTS_calloc(sVar7 * sVar12,8);
              pHVar9->vari[uVar21] = pdVar11;
              uVar21 = uVar21 + 1;
            } while (uVar21 < sss->total_state);
          }
          HVar4 = HTS_ModelSet_use_gv(ms,sVar6);
          if (HVar4 == '\0') {
            pHVar9->gv_switch = (HTS_Boolean *)0x0;
          }
          else {
            pHVar13 = (HTS_Boolean *)HTS_calloc(sss->total_state,1);
            pHVar9->gv_switch = pHVar13;
            if (sss->total_state != 0) {
              uVar21 = 0;
              do {
                pHVar9->gv_switch[uVar21] = '\x01';
                uVar21 = uVar21 + 1;
              } while (uVar21 < sss->total_state);
            }
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 < sss->nstream);
      }
      pdVar11 = (double *)HTS_calloc(sss->total_state,8);
      vari = (double *)HTS_calloc(sss->total_state,8);
      sVar6 = HTS_Label_get_size(label);
      if (sVar6 != 0) {
        sVar6 = 0;
        do {
          pcVar14 = HTS_Label_get_string(label,sVar6);
          lVar18 = sss->nstate * sVar6;
          HTS_ModelSet_get_duration(ms,pcVar14,duration_iw,pdVar11 + lVar18,vari + lVar18);
          sVar6 = sVar6 + 1;
          sVar7 = HTS_Label_get_size(label);
        } while (sVar6 < sVar7);
      }
      if (phoneme_alignment_flag == '\x01') {
        sVar6 = HTS_Label_get_size(label);
        if (sVar6 != 0) {
          lVar22 = 0;
          local_68 = 0;
          sVar6 = 0;
          lVar18 = 0;
          do {
            dVar23 = HTS_Label_get_end_frame(label,sVar6);
            if (0.0 <= dVar23) {
              auVar24._8_4_ = (int)(local_68 >> 0x20);
              auVar24._0_8_ = local_68;
              auVar24._12_4_ = 0x45300000;
              dVar23 = HTS_set_specified_duration
                                 (sss->duration + lVar22,pdVar11 + lVar22,vari + lVar22,
                                  (lVar18 - lVar22) + sss->nstate,
                                  dVar23 - ((auVar24._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)local_68) -
                                           4503599627370496.0)));
              local_68 = local_68 +
                         ((long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f |
                         (long)dVar23);
              lVar22 = sss->nstate + lVar18;
            }
            else {
              sVar7 = HTS_Label_get_size(label);
              if (sVar6 + 1 == sVar7) {
                HTS_error(-1,"HTS_SStreamSet_create: The time of final label is not specified.\n");
                lVar15 = sss->nstate + lVar18;
                if (lVar15 != lVar22) {
                  psVar8 = sss->duration;
                  lVar19 = lVar22;
                  do {
                    dVar23 = 1.0;
                    if (1.0 <= pdVar11[lVar19] + 0.5) {
                      dVar23 = pdVar11[lVar19] + 0.5;
                    }
                    psVar8[lVar19] =
                         (long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f |
                         (long)dVar23;
                    lVar19 = lVar19 + 1;
                  } while (lVar15 != lVar19);
                }
              }
            }
            sVar6 = sVar6 + 1;
            lVar18 = lVar18 + sss->nstate;
            sVar7 = HTS_Label_get_size(label);
          } while (sVar6 < sVar7);
        }
      }
      else if ((speed != 1.0) || (NAN(speed))) {
        sVar6 = sss->total_state;
        dVar23 = 0.0;
        if (sVar6 != 0) {
          sVar7 = 0;
          do {
            dVar23 = dVar23 + pdVar11[sVar7];
            sVar7 = sVar7 + 1;
          } while (sVar6 != sVar7);
        }
        HTS_set_specified_duration(sss->duration,pdVar11,vari,sVar6,dVar23 / speed);
      }
      else {
        sVar6 = sss->total_state;
        if (sVar6 != 0) {
          psVar8 = sss->duration;
          sVar7 = 0;
          do {
            dVar23 = 1.0;
            if (1.0 <= pdVar11[sVar7] + 0.5) {
              dVar23 = pdVar11[sVar7] + 0.5;
            }
            psVar8[sVar7] =
                 (long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f | (long)dVar23;
            sVar7 = sVar7 + 1;
          } while (sVar6 != sVar7);
        }
      }
      HTS_free(pdVar11);
      HTS_free(vari);
      sVar6 = HTS_Label_get_size(label);
      if (sVar6 != 0) {
        local_68 = 0;
        lVar18 = 0;
        do {
          sVar6 = sss->nstate;
          if (1 < sVar6 + 1) {
            uVar21 = sss->nstream;
            sVar7 = 2;
            do {
              sss->total_frame = sss->total_frame + sss->duration[lVar18];
              if (uVar21 == 0) {
                uVar21 = 0;
              }
              else {
                lVar22 = 0x18;
                sVar6 = 0;
                do {
                  pHVar9 = sss->sstream;
                  lVar15 = *(long *)((long)&pHVar9->vector_length + lVar22);
                  pcVar14 = HTS_Label_get_string(label,local_68);
                  if (lVar15 == 0) {
                    pdVar11 = (double *)0x0;
                  }
                  else {
                    pdVar11 = (double *)
                              (lVar18 * 8 + *(long *)((long)&pHVar9->vector_length + lVar22));
                  }
                  HTS_ModelSet_get_parameter
                            (ms,sVar6,sVar7,pcVar14,parameter_iw,
                             *(double **)(*(long *)((long)pHVar9 + lVar22 + -0x10) + lVar18 * 8),
                             *(double **)(*(long *)((long)pHVar9 + lVar22 + -8) + lVar18 * 8),
                             pdVar11);
                  sVar6 = sVar6 + 1;
                  uVar21 = sss->nstream;
                  lVar22 = lVar22 + 0x60;
                } while (sVar6 < uVar21);
                sVar6 = sss->nstate;
              }
              lVar18 = lVar18 + 1;
              sVar7 = sVar7 + 1;
            } while (sVar7 <= sVar6 + 1);
          }
          local_68 = local_68 + 1;
          sVar6 = HTS_Label_get_size(label);
        } while (local_68 < sVar6);
      }
      if (sss->nstream != 0) {
        sVar6 = 0;
        do {
          pHVar9 = sss->sstream;
          sVar7 = HTS_ModelSet_get_window_size(ms,sVar6);
          pHVar9[sVar6].win_size = sVar7;
          sVar7 = HTS_ModelSet_get_window_max_width(ms,sVar6);
          pHVar9[sVar6].win_max_width = sVar7;
          piVar16 = (int *)HTS_calloc(pHVar9[sVar6].win_size,4);
          pHVar9[sVar6].win_l_width = piVar16;
          piVar16 = (int *)HTS_calloc(pHVar9[sVar6].win_size,4);
          pHVar9[sVar6].win_r_width = piVar16;
          ppdVar10 = (double **)HTS_calloc(pHVar9[sVar6].win_size,8);
          pHVar9[sVar6].win_coefficient = ppdVar10;
          if (pHVar9[sVar6].win_size != 0) {
            sVar7 = 0;
            do {
              iVar5 = HTS_ModelSet_get_window_left_width(ms,sVar6,sVar7);
              pHVar9[sVar6].win_l_width[sVar7] = iVar5;
              iVar5 = HTS_ModelSet_get_window_right_width(ms,sVar6,sVar7);
              pHVar9[sVar6].win_r_width[sVar7] = iVar5;
              pdVar11 = (double *)
                        HTS_calloc((long)(int)((uint)(iVar5 + pHVar9[sVar6].win_l_width[sVar7] == 0)
                                              + pHVar9[sVar6].win_l_width[sVar7] * -2),8);
              pHVar9[sVar6].win_coefficient[sVar7] = pdVar11;
              pHVar9[sVar6].win_coefficient[sVar7] =
                   pHVar9[sVar6].win_coefficient[sVar7] + -(long)pHVar9[sVar6].win_l_width[sVar7];
              sVar12 = (long)pHVar9[sVar6].win_l_width[sVar7];
              if (pHVar9[sVar6].win_l_width[sVar7] <= pHVar9[sVar6].win_r_width[sVar7]) {
                do {
                  dVar23 = HTS_ModelSet_get_window_coefficient(ms,sVar6,sVar7,sVar12);
                  pHVar9[sVar6].win_coefficient[sVar7][sVar12] = dVar23;
                  bVar3 = (long)sVar12 < (long)pHVar9[sVar6].win_r_width[sVar7];
                  sVar12 = sVar12 + 1;
                } while (bVar3);
              }
              sVar7 = sVar7 + 1;
            } while (sVar7 < pHVar9[sVar6].win_size);
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 < sss->nstream);
        if (sss->nstream != 0) {
          lVar18 = 0x50;
          sVar6 = 0;
          do {
            pHVar9 = sss->sstream;
            HVar4 = HTS_ModelSet_use_gv(ms,sVar6);
            if (HVar4 == '\0') {
              puVar1 = (undefined8 *)((long)pHVar9 + lVar18 + -8);
              *puVar1 = 0;
              puVar1[1] = 0;
            }
            else {
              pvVar17 = HTS_calloc(*(size_t *)((long)pHVar9 + lVar18 + -0x50),8);
              *(void **)((long)pHVar9 + lVar18 + -8) = pvVar17;
              pvVar17 = HTS_calloc(*(size_t *)((long)pHVar9 + lVar18 + -0x50),8);
              *(void **)((long)&pHVar9->vector_length + lVar18) = pvVar17;
              pcVar14 = HTS_Label_get_string(label,0);
              HTS_ModelSet_get_gv(ms,sVar6,pcVar14,gv_iw,*(double **)((long)pHVar9 + lVar18 + -8),
                                  *(double **)((long)&pHVar9->vector_length + lVar18));
            }
            sVar6 = sVar6 + 1;
            lVar18 = lVar18 + 0x60;
          } while (sVar6 < sss->nstream);
        }
      }
      sVar6 = HTS_Label_get_size(label);
      if (sVar6 != 0) {
        sVar6 = 0;
        do {
          pcVar14 = HTS_Label_get_string(label,sVar6);
          HVar4 = HTS_ModelSet_get_gv_flag(ms,pcVar14);
          if ((HVar4 == '\0') && (sss->nstream != 0)) {
            sVar7 = 0;
            do {
              HVar4 = HTS_ModelSet_use_gv(ms,sVar7);
              if ((HVar4 == '\x01') && (uVar21 = sss->nstate, uVar21 != 0)) {
                uVar20 = 0;
                do {
                  sss->sstream[sVar7].gv_switch[uVar20 + uVar21 * sVar6] = '\0';
                  uVar20 = uVar20 + 1;
                  uVar21 = sss->nstate;
                } while (uVar20 < uVar21);
              }
              sVar7 = sVar7 + 1;
            } while (sVar7 < sss->nstream);
          }
          sVar6 = sVar6 + 1;
          sVar7 = HTS_Label_get_size(label);
        } while (sVar6 < sVar7);
        return '\x01';
      }
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_SStreamSet_create(HTS_SStreamSet * sss, HTS_ModelSet * ms, HTS_Label * label, HTS_Boolean phoneme_alignment_flag, double speed, double *duration_iw, double **parameter_iw, double **gv_iw)
{
   size_t i, j, k;
   double temp;
   int shift;
   size_t state;
   HTS_SStream *sst;
   double *duration_mean, *duration_vari;
   double frame_length;
   size_t next_time;
   size_t next_state;

   if (HTS_Label_get_size(label) == 0)
      return FALSE;

   /* check interpolation weights */
   for (i = 0, temp = 0.0; i < HTS_ModelSet_get_nvoices(ms); i++)
      temp += duration_iw[i];
   if (temp == 0.0) {
      return FALSE;
   } else if (temp != 1.0) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
         if (duration_iw[i] != 0.0)
            duration_iw[i] /= temp;
   }

   for (i = 0; i < HTS_ModelSet_get_nstream(ms); i++) {
      for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
         temp += parameter_iw[j][i];
      if (temp == 0.0) {
         return FALSE;
      } else if (temp != 1.0) {
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            if (parameter_iw[j][i] != 0.0)
               parameter_iw[j][i] /= temp;
      }
      if (HTS_ModelSet_use_gv(ms, i)) {
         for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
            temp += gv_iw[j][i];
         if (temp == 0.0)
            return FALSE;
         else if (temp != 1.0)
            for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
               if (gv_iw[j][i] != 0.0)
                  gv_iw[j][i] /= temp;
      }
   }

   /* initialize state sequence */
   sss->nstate = HTS_ModelSet_get_nstate(ms);
   sss->nstream = HTS_ModelSet_get_nstream(ms);
   sss->total_frame = 0;
   sss->total_state = HTS_Label_get_size(label) * sss->nstate;
   sss->duration = (size_t *) HTS_calloc(sss->total_state, sizeof(size_t));
   sss->sstream = (HTS_SStream *) HTS_calloc(sss->nstream, sizeof(HTS_SStream));
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      sst->vector_length = HTS_ModelSet_get_vector_length(ms, i);
      sst->mean = (double **) HTS_calloc(sss->total_state, sizeof(double *));
      sst->vari = (double **) HTS_calloc(sss->total_state, sizeof(double *));
      if (HTS_ModelSet_is_msd(ms, i))
         sst->msd = (double *) HTS_calloc(sss->total_state, sizeof(double));
      else
         sst->msd = NULL;
      for (j = 0; j < sss->total_state; j++) {
         sst->mean[j] = (double *) HTS_calloc(sst->vector_length * HTS_ModelSet_get_window_size(ms, i), sizeof(double));
         sst->vari[j] = (double *) HTS_calloc(sst->vector_length * HTS_ModelSet_get_window_size(ms, i), sizeof(double));
      }
      if (HTS_ModelSet_use_gv(ms, i)) {
         sst->gv_switch = (HTS_Boolean *) HTS_calloc(sss->total_state, sizeof(HTS_Boolean));
         for (j = 0; j < sss->total_state; j++)
            sst->gv_switch[j] = TRUE;
      } else {
         sst->gv_switch = NULL;
      }
   }

   /* determine state duration */
   duration_mean = (double *) HTS_calloc(sss->total_state, sizeof(double));
   duration_vari = (double *) HTS_calloc(sss->total_state, sizeof(double));
   for (i = 0; i < HTS_Label_get_size(label); i++)
      HTS_ModelSet_get_duration(ms, HTS_Label_get_string(label, i), duration_iw, &duration_mean[i * sss->nstate], &duration_vari[i * sss->nstate]);
   if (phoneme_alignment_flag == TRUE) {
      /* use duration set by user */
      next_time = 0;
      next_state = 0;
      state = 0;
      for (i = 0; i < HTS_Label_get_size(label); i++) {
         temp = HTS_Label_get_end_frame(label, i);
         if (temp >= 0) {
            next_time += (size_t) HTS_set_specified_duration(&sss->duration[next_state], &duration_mean[next_state], &duration_vari[next_state], state + sss->nstate - next_state, temp - next_time);
            next_state = state + sss->nstate;
         } else if (i + 1 == HTS_Label_get_size(label)) {
            HTS_error(-1, "HTS_SStreamSet_create: The time of final label is not specified.\n");
            HTS_set_default_duration(&sss->duration[next_state], &duration_mean[next_state], &duration_vari[next_state], state + sss->nstate - next_state);
         }
         state += sss->nstate;
      }
   } else {
      /* determine frame length */
      if (speed != 1.0) {
         temp = 0.0;
         for (i = 0; i < sss->total_state; i++) {
            temp += duration_mean[i];
         }
         frame_length = temp / speed;
         HTS_set_specified_duration(sss->duration, duration_mean, duration_vari, sss->total_state, frame_length);
      } else {
         HTS_set_default_duration(sss->duration, duration_mean, duration_vari, sss->total_state);
      }
   }
   HTS_free(duration_mean);
   HTS_free(duration_vari);

   /* get parameter */
   for (i = 0, state = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 2; j <= sss->nstate + 1; j++) {
         sss->total_frame += sss->duration[state];
         for (k = 0; k < sss->nstream; k++) {
            sst = &sss->sstream[k];
            if (sst->msd)
               HTS_ModelSet_get_parameter(ms, k, j, HTS_Label_get_string(label, i), (const double *const *) parameter_iw, sst->mean[state], sst->vari[state], &sst->msd[state]);
            else
               HTS_ModelSet_get_parameter(ms, k, j, HTS_Label_get_string(label, i), (const double *const *) parameter_iw, sst->mean[state], sst->vari[state], NULL);
         }
         state++;
      }
   }

   /* copy dynamic window */
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      sst->win_size = HTS_ModelSet_get_window_size(ms, i);
      sst->win_max_width = HTS_ModelSet_get_window_max_width(ms, i);
      sst->win_l_width = (int *) HTS_calloc(sst->win_size, sizeof(int));
      sst->win_r_width = (int *) HTS_calloc(sst->win_size, sizeof(int));
      sst->win_coefficient = (double **) HTS_calloc(sst->win_size, sizeof(double));
      for (j = 0; j < sst->win_size; j++) {
         sst->win_l_width[j] = HTS_ModelSet_get_window_left_width(ms, i, j);
         sst->win_r_width[j] = HTS_ModelSet_get_window_right_width(ms, i, j);
         if (sst->win_l_width[j] + sst->win_r_width[j] == 0)
            sst->win_coefficient[j] = (double *) HTS_calloc(-2 * sst->win_l_width[j] + 1, sizeof(double));
         else
            sst->win_coefficient[j] = (double *) HTS_calloc(-2 * sst->win_l_width[j], sizeof(double));
         sst->win_coefficient[j] -= sst->win_l_width[j];
         for (shift = sst->win_l_width[j]; shift <= sst->win_r_width[j]; shift++)
            sst->win_coefficient[j][shift] = HTS_ModelSet_get_window_coefficient(ms, i, j, shift);
      }
   }

   /* determine GV */
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      if (HTS_ModelSet_use_gv(ms, i)) {
         sst->gv_mean = (double *) HTS_calloc(sst->vector_length, sizeof(double));
         sst->gv_vari = (double *) HTS_calloc(sst->vector_length, sizeof(double));
         HTS_ModelSet_get_gv(ms, i, HTS_Label_get_string(label, 0), (const double *const *) gv_iw, sst->gv_mean, sst->gv_vari);
      } else {
         sst->gv_mean = NULL;
         sst->gv_vari = NULL;
      }
   }

   for (i = 0; i < HTS_Label_get_size(label); i++)
      if (HTS_ModelSet_get_gv_flag(ms, HTS_Label_get_string(label, i)) == FALSE)
         for (j = 0; j < sss->nstream; j++)
            if (HTS_ModelSet_use_gv(ms, j) == TRUE)
               for (k = 0; k < sss->nstate; k++)
                  sss->sstream[j].gv_switch[i * sss->nstate + k] = FALSE;

   return TRUE;
}